

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> * __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::Find1P1CPackage
          (PeerManagerImpl *this,CTransactionRef *ptx,NodeId nodeid)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  Span<const_unsigned_char> vKey;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  Span<const_unsigned_char> vKey_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  Span<const_unsigned_char> vKey_01;
  bool bVar1;
  TxOrphanage *in_RDI;
  long in_FS_OFFSET;
  type *child_sender;
  type *child_tx;
  unsigned_long index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  shared_ptr<const_CTransaction> *child;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  Wtxid *parent_wtxid;
  Package maybe_cpfp_package_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tx_indices;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  cpfp_candidates_different_peer;
  Package maybe_cpfp_package;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  cpfp_candidates_same_peer;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  char *in_stack_fffffffffffffc80;
  allocator_type *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc98;
  allocator_type *in_stack_fffffffffffffca0;
  allocator_type *in_stack_fffffffffffffca8;
  allocator_type *in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffcb8;
  undefined1 *puVar2;
  FastRandomContext *in_stack_fffffffffffffcd0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffffcf8;
  NodeId in_stack_fffffffffffffd00;
  NodeId in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  CRollingBloomFilter *in_stack_fffffffffffffd18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd28;
  PackageToValidate *local_2d0;
  undefined1 *in_stack_fffffffffffffd40;
  TxOrphanage *this_00;
  undefined1 local_188 [24];
  unsigned_long *local_170;
  unsigned_long *local_168;
  undefined1 local_e1 [25];
  shared_ptr<const_CTransaction> *local_c8;
  shared_ptr<const_CTransaction> *local_c0;
  undefined1 local_89;
  allocator_type local_68 [32];
  allocator_type local_48 [32];
  undefined1 local_28 [40];
  
  local_28._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockNotHeldInline
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             (char *)in_stack_fffffffffffffc70._M_current,in_stack_fffffffffffffc6c,
             (Mutex *)0x108dbba);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             (char *)in_stack_fffffffffffffc70._M_current,in_stack_fffffffffffffc6c,
             (AnnotatedMixin<std::mutex> *)0x108dbd9);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             (char *)in_stack_fffffffffffffc70._M_current,in_stack_fffffffffffffc6c,
             (AnnotatedMixin<std::mutex> *)0x108dc00);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  CTransaction::GetWitnessHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  RecentRejectsReconsiderableFilter((PeerManagerImpl *)in_stack_fffffffffffffc70._M_current);
  transaction_identifier<true>::ToUint256
            ((transaction_identifier<true> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             (uint256 *)in_stack_fffffffffffffc70._M_current,
             (type)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  vKey.m_size = in_stack_fffffffffffffcb8;
  vKey.m_data = (uchar *)in_stack_fffffffffffffcb0;
  local_89 = CRollingBloomFilter::contains
                       ((CRollingBloomFilter *)
                        CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),vKey);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
             (char *)in_stack_fffffffffffffc70._M_current,
             (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  TxOrphanage::GetChildrenFromSamePeer
            (this_00,(CTransactionRef *)in_RDI,(NodeId)in_stack_fffffffffffffd40);
  local_c0 = (shared_ptr<const_CTransaction> *)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffffc70._M_current);
  local_c8 = (shared_ptr<const_CTransaction> *)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffc70._M_current);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffc70._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (shared_ptr<const_CTransaction> *)0x108dd58);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (shared_ptr<const_CTransaction> *)0x108dd6d);
    in_stack_fffffffffffffd40 = local_e1;
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    __l._M_len = in_stack_fffffffffffffcb8;
    __l._M_array = (iterator)in_stack_fffffffffffffcb0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffffca8,__l,in_stack_fffffffffffffca0);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    in_stack_fffffffffffffd28._M_current = (unsigned_long *)local_28;
    local_2d0 = (PackageToValidate *)(local_28 + 0x20);
    do {
      in_stack_fffffffffffffd20._M_current =
           (unsigned_long *)
           &local_2d0[-1].m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish;
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      local_2d0 = (PackageToValidate *)in_stack_fffffffffffffd20._M_current;
    } while (in_stack_fffffffffffffd20._M_current != in_stack_fffffffffffffd28._M_current);
    in_stack_fffffffffffffd18 =
         RecentRejectsReconsiderableFilter((PeerManagerImpl *)in_stack_fffffffffffffc70._M_current);
    GetPackageHash(in_stack_fffffffffffffcf8);
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               (uint256 *)in_stack_fffffffffffffc70._M_current,
               (type)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    vKey_00.m_size = in_stack_fffffffffffffcb8;
    vKey_00.m_data = (uchar *)in_stack_fffffffffffffcb0;
    in_stack_fffffffffffffd17 =
         CRollingBloomFilter::contains
                   ((CRollingBloomFilter *)
                    CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),vKey_00);
    bVar1 = ((in_stack_fffffffffffffd17 ^ 0xff) & 1) != 0;
    if (bVar1) {
      PackageToValidate::PackageToValidate
                ((PackageToValidate *)in_stack_fffffffffffffd20._M_current,
                 (CTransactionRef *)in_stack_fffffffffffffd18,
                 (CTransactionRef *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::
      optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true>
                ((optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (PackageToValidate *)in_stack_fffffffffffffc70._M_current);
      PackageToValidate::~PackageToValidate
                ((PackageToValidate *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
      ;
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    if (bVar1) goto LAB_0108e551;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  TxOrphanage::GetChildrenFromDifferentPeer
            (this_00,(CTransactionRef *)in_RDI,(NodeId)in_stack_fffffffffffffd40);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::size((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
          *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::allocator<unsigned_long>::allocator
            ((allocator<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffc98,CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
             ,in_stack_fffffffffffffc88);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc70._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc70._M_current);
  __first._M_current._4_4_ = in_stack_fffffffffffffc7c;
  __first._M_current._0_4_ = in_stack_fffffffffffffc78;
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (__first,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc70._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffc70._M_current);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffcd0);
  local_168 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        (in_stack_fffffffffffffc70._M_current);
  local_170 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        (in_stack_fffffffffffffc70._M_current);
  while (bVar1 = __gnu_cxx::
                 operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffc70._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    std::
    vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
    ::at((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
          *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
         (size_type)in_stack_fffffffffffffc70._M_current);
    puVar2 = local_188;
    std::pair<std::shared_ptr<const_CTransaction>,_long>::pair
              ((pair<std::shared_ptr<const_CTransaction>,_long> *)
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               (pair<std::shared_ptr<const_CTransaction>,_long> *)
               in_stack_fffffffffffffc70._M_current);
    std::get<0ul,std::shared_ptr<CTransaction_const>,long>
              ((pair<std::shared_ptr<const_CTransaction>,_long> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    std::get<1ul,std::shared_ptr<CTransaction_const>,long>
              ((pair<std::shared_ptr<const_CTransaction>,_long> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (shared_ptr<const_CTransaction> *)0x108e20a);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
               (shared_ptr<const_CTransaction> *)0x108e21f);
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    __l_00._M_len = (size_type)puVar2;
    __l_00._M_array = (iterator)in_stack_fffffffffffffcb0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffffca8,__l_00,in_stack_fffffffffffffca0);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    in_stack_fffffffffffffca8 = local_68;
    in_stack_fffffffffffffca0 = local_48;
    do {
      in_stack_fffffffffffffca0 = in_stack_fffffffffffffca0 + -0x10;
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    } while (in_stack_fffffffffffffca0 != in_stack_fffffffffffffca8);
    in_stack_fffffffffffffcb0 = in_stack_fffffffffffffca0;
    RecentRejectsReconsiderableFilter((PeerManagerImpl *)in_stack_fffffffffffffc70._M_current);
    GetPackageHash(in_stack_fffffffffffffcf8);
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               (uint256 *)in_stack_fffffffffffffc70._M_current,
               (type)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    vKey_01.m_size = (size_t)puVar2;
    vKey_01.m_data = (uchar *)in_stack_fffffffffffffcb0;
    in_stack_fffffffffffffc97 =
         CRollingBloomFilter::contains
                   ((CRollingBloomFilter *)
                    CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),vKey_01);
    bVar1 = ((in_stack_fffffffffffffc97 ^ 0xff) & 1) != 0;
    if (bVar1) {
      PackageToValidate::PackageToValidate
                ((PackageToValidate *)in_stack_fffffffffffffd20._M_current,
                 (CTransactionRef *)in_stack_fffffffffffffd18,
                 (CTransactionRef *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::
      optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true>
                ((optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (PackageToValidate *)in_stack_fffffffffffffc70._M_current);
      PackageToValidate::~PackageToValidate
                ((PackageToValidate *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
      ;
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    std::pair<std::shared_ptr<const_CTransaction>,_long>::~pair
              ((pair<std::shared_ptr<const_CTransaction>,_long> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if (bVar1) goto LAB_0108e519;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::optional
            ((optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> *)in_RDI);
LAB_0108e519:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
             *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
LAB_0108e551:
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  if (*(pointer *)(in_FS_OFFSET + 0x28) != (pointer)local_28._32_8_) {
    __stack_chk_fail();
  }
  return (optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> *)this_00;
}

Assistant:

std::optional<PeerManagerImpl::PackageToValidate> PeerManagerImpl::Find1P1CPackage(const CTransactionRef& ptx, NodeId nodeid)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    const auto& parent_wtxid{ptx->GetWitnessHash()};

    Assume(RecentRejectsReconsiderableFilter().contains(parent_wtxid.ToUint256()));

    // Prefer children from this peer. This helps prevent censorship attempts in which an attacker
    // sends lots of fake children for the parent, and we (unluckily) keep selecting the fake
    // children instead of the real one provided by the honest peer.
    const auto cpfp_candidates_same_peer{m_orphanage.GetChildrenFromSamePeer(ptx, nodeid)};

    // These children should be sorted from newest to oldest. In the (probably uncommon) case
    // of children that replace each other, this helps us accept the highest feerate (probably the
    // most recent) one efficiently.
    for (const auto& child : cpfp_candidates_same_peer) {
        Package maybe_cpfp_package{ptx, child};
        if (!RecentRejectsReconsiderableFilter().contains(GetPackageHash(maybe_cpfp_package))) {
            return PeerManagerImpl::PackageToValidate{ptx, child, nodeid, nodeid};
        }
    }

    // If no suitable candidate from the same peer is found, also try children that were provided by
    // a different peer. This is useful because sometimes multiple peers announce both transactions
    // to us, and we happen to download them from different peers (we wouldn't have known that these
    // 2 transactions are related). We still want to find 1p1c packages then.
    //
    // If we start tracking all announcers of orphans, we can restrict this logic to parent + child
    // pairs in which both were provided by the same peer, i.e. delete this step.
    const auto cpfp_candidates_different_peer{m_orphanage.GetChildrenFromDifferentPeer(ptx, nodeid)};

    // Find the first 1p1c that hasn't already been rejected. We randomize the order to not
    // create a bias that attackers can use to delay package acceptance.
    //
    // Create a random permutation of the indices.
    std::vector<size_t> tx_indices(cpfp_candidates_different_peer.size());
    std::iota(tx_indices.begin(), tx_indices.end(), 0);
    std::shuffle(tx_indices.begin(), tx_indices.end(), m_rng);

    for (const auto index : tx_indices) {
        // If we already tried a package and failed for any reason, the combined hash was
        // cached in m_lazy_recent_rejects_reconsiderable.
        const auto [child_tx, child_sender] = cpfp_candidates_different_peer.at(index);
        Package maybe_cpfp_package{ptx, child_tx};
        if (!RecentRejectsReconsiderableFilter().contains(GetPackageHash(maybe_cpfp_package))) {
            return PeerManagerImpl::PackageToValidate{ptx, child_tx, nodeid, child_sender};
        }
    }
    return std::nullopt;
}